

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingVBRTest(DatarateTestLarge *this)

{
  bool bVar1;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var2;
  Message *pMVar3;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe84;
  double *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  int line;
  char *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  Type type;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 uVar6;
  uint in_stack_fffffffffffffec0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_e8 [2];
  uint local_c4;
  HasNewFatalFailureHelper local_c0;
  undefined8 local_a8 [3];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  *(undefined4 *)(in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0xc0) = 0x3f;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",&local_89);
  uVar5 = 0x8c;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8,(uint)((ulong)in_stack_fffffffffffffea0 >> 0x20),
             (uint)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffec0,(int)in_RDI);
  type = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 0x32000000190;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x782154);
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)((long)local_a8 + (long)*p_Var2 * 4);
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x98))(in_RDI + 0x18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)
               CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c0);
    if (bVar1) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
    if (local_c4 == 0) {
      testing::internal::CmpHelperGE<double,double>
                ((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (double *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      uVar6 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffeb0));
        pMVar3 = testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffe84,uVar5),
                            (char (*) [61])CONCAT44(in_stack_fffffffffffffe7c,uVar4));
        type = (Type)((ulong)pMVar3 >> 0x20);
        in_stack_fffffffffffffea0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x78245e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffeb0),type,
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
        testing::Message::~Message((Message *)0x7824b8);
      }
      local_c4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x782526);
      if (local_c4 == 0) {
        testing::internal::CmpHelperLE<double,double>
                  ((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (double *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffef0);
        line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe9c);
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffeb0));
          pMVar3 = testing::Message::operator<<
                             ((Message *)CONCAT44(in_stack_fffffffffffffe84,uVar5),
                              (char (*) [63])CONCAT44(in_stack_fffffffffffffe7c,uVar4));
          testing::AssertionResult::failure_message((AssertionResult *)0x7825fa);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffeb0),type,
                     in_stack_fffffffffffffea0,line,(char *)pMVar3);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
          testing::Message::~Message((Message *)0x782648);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7826aa);
        if (local_c4 == 0) {
          local_c4 = 0;
        }
      }
      goto LAB_007826c2;
    }
    if (local_c4 != 2) goto LAB_007826c2;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),type,
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff00,(Message *)in_stack_fffffffffffffef8._M_head_impl);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe84,uVar5));
  testing::Message::~Message((Message *)0x78233f);
  local_c4 = 1;
LAB_007826c2:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7826cf);
  return;
}

Assistant:

virtual void BasicRateTargetingVBRTest() {
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.g_error_resilient = 0;
    cfg_.rc_end_usage = AOM_VBR;
    cfg_.g_lag_in_frames = 0;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 140);
    const int bitrate_array[2] = { 400, 800 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(effective_datarate_, cfg_.rc_target_bitrate * 0.7)
        << " The datarate for the file is lower than target by too much!";
    // FIXME(jingning): Lower this test threshold after vbr mode can render
    // sufficiently accurate bit rate.
    ASSERT_LE(effective_datarate_, cfg_.rc_target_bitrate * 1.45)
        << " The datarate for the file is greater than target by too much!";
  }